

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O1

string * __thiscall pbrt::Disk::ToString_abi_cxx11_(string *__return_storage_ptr__,Disk *this)

{
  Transform *v;
  Transform *args;
  
  v = this->renderFromObject;
  args = this->objectFromRender;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::Transform_const&,pbrt::Transform_const&,bool_const&,bool_const&,float_const&,float_const&,float_const&,float_const&>
            (__return_storage_ptr__,
             "[ Disk renderFromObject: %s objectFromRender: %s reverseOrientation: %s transformSwapsHandedness: %s height: %f radius: %f innerRadius: %f phiMax: %f ]"
             ,v,args,&this->reverseOrientation,&this->transformSwapsHandedness,&this->height,
             &this->radius,&this->innerRadius,&this->phiMax);
  return __return_storage_ptr__;
}

Assistant:

std::string Disk::ToString() const {
    return StringPrintf(
        "[ Disk renderFromObject: %s objectFromRender: %s "
        "reverseOrientation: %s "
        "transformSwapsHandedness: %s height: %f radius: %f innerRadius: %f "
        "phiMax: %f ]",
        *renderFromObject, *objectFromRender, reverseOrientation,
        transformSwapsHandedness, height, radius, innerRadius, phiMax);
}